

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransformDerivative.cpp
# Opt level: O1

Matrix6x6 * __thiscall
iDynTree::TransformDerivative::asAdjointTransformWrenchDerivative
          (Matrix6x6 *__return_storage_ptr__,TransformDerivative *this,Transform *transform)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined8 uVar12;
  Position *pPVar13;
  double *pdVar14;
  long lVar15;
  Matrix3x3 *pMVar16;
  double adStack_80 [4];
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  
  pMVar16 = &this->rotDerivative;
  adStack_80[0] = 6.52076732562902e-318;
  pPVar13 = Transform::getPosition(transform);
  adStack_80[0] = 6.52082167285007e-318;
  pdVar14 = (double *)Transform::getRotation(transform);
  lVar15 = 0;
  do {
    puVar2 = (undefined8 *)((long)(this->rotDerivative).m_data + lVar15);
    uVar12 = puVar2[1];
    puVar1 = (undefined8 *)((long)__return_storage_ptr__->m_data + lVar15 * 2);
    *puVar1 = *puVar2;
    puVar1[1] = uVar12;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar15 * 2 + 0x10) =
         *(undefined8 *)((long)(this->rotDerivative).m_data + lVar15 + 0x10);
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x48);
  lVar15 = 0x28;
  do {
    *(undefined1 (*) [16])((long)__return_storage_ptr__->m_data + lVar15 + -0x10) =
         (undefined1  [16])0x0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar15) = 0;
    lVar15 = lVar15 + 0x30;
  } while (lVar15 != 0xb8);
  dVar3 = (this->posDerivative).m_data[2];
  dVar8 = (this->posDerivative).m_data[0];
  dVar9 = (this->posDerivative).m_data[1];
  dVar4 = (pPVar13->super_Vector3).m_data[2];
  dVar10 = (pPVar13->super_Vector3).m_data[0];
  dVar11 = (pPVar13->super_Vector3).m_data[1];
  lVar15 = 2;
  do {
    dVar5 = *pdVar14;
    dVar6 = pdVar14[3];
    dVar7 = pdVar14[6];
    adStack_80[lVar15] = dVar7 * dVar9 + dVar6 * -dVar3 + dVar5 * 0.0;
    adStack_80[lVar15 + 1] = dVar7 * -dVar8 + dVar6 * 0.0 + dVar5 * dVar3;
    adStack_80[lVar15 + 2] = (dVar7 * 0.0 + dVar6 * dVar8) - dVar5 * dVar9;
    lVar15 = lVar15 + 3;
    pdVar14 = pdVar14 + 1;
  } while (lVar15 != 0xb);
  lVar15 = 2;
  do {
    dVar3 = pMVar16->m_data[0];
    dVar8 = pMVar16->m_data[3];
    dVar9 = pMVar16->m_data[6];
    adStack_80[lVar15] =
         adStack_80[lVar15] +
         dVar9 * dVar11 + dVar8 * (double)((ulong)dVar4 ^ (ulong)DAT_00153040) + dVar3 * 0.0;
    adStack_80[lVar15 + 1] = adStack_80[lVar15 + 1] + dVar9 * -dVar10 + dVar8 * 0.0 + dVar3 * dVar4;
    adStack_80[lVar15 + 2] =
         ((dVar9 * 0.0 + dVar8 * dVar10) - dVar3 * dVar11) + adStack_80[lVar15 + 2];
    lVar15 = lVar15 + 3;
    pMVar16 = (Matrix3x3 *)(pMVar16->m_data + 1);
  } while (lVar15 != 0xb);
  __return_storage_ptr__->m_data[0x12] = adStack_80[2];
  __return_storage_ptr__->m_data[0x13] = local_58;
  __return_storage_ptr__->m_data[0x14] = local_40;
  __return_storage_ptr__->m_data[0x18] = adStack_80[3];
  __return_storage_ptr__->m_data[0x19] = local_50;
  __return_storage_ptr__->m_data[0x1a] = local_38;
  __return_storage_ptr__->m_data[0x1e] = local_60;
  __return_storage_ptr__->m_data[0x1f] = local_48;
  __return_storage_ptr__->m_data[0x20] = local_30;
  lVar15 = 0;
  do {
    puVar1 = (undefined8 *)((long)(this->rotDerivative).m_data + lVar15);
    uVar12 = puVar1[1];
    puVar2 = (undefined8 *)((long)__return_storage_ptr__->m_data + lVar15 * 2 + 0xa8);
    *puVar2 = *puVar1;
    puVar2[1] = uVar12;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar15 * 2 + 0xb8) =
         *(undefined8 *)((long)(this->rotDerivative).m_data + lVar15 + 0x10);
    lVar15 = lVar15 + 0x18;
  } while (lVar15 != 0x48);
  return __return_storage_ptr__;
}

Assistant:

Matrix6x6 TransformDerivative::asAdjointTransformWrenchDerivative(const Transform& transform) const
{
    Matrix6x6 ret;

    Eigen::Map< Eigen::Matrix<double,6,6,Eigen::RowMajor> > retEigen(ret.data());

    Eigen::Map<const Eigen::Vector3d> dp(this->posDerivative.data());
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > dR(this->rotDerivative.data());

    Eigen::Map<const Eigen::Vector3d> p(transform.getPosition().data());
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > R(transform.getRotation().data());

    retEigen.block<3,3>(0,0) = dR;
    retEigen.block<3,3>(0,3).setZero();
    retEigen.block<3,3>(3,0) = mySkeww(dp)*R + mySkeww(p)*dR;
    retEigen.block<3,3>(3,3) = dR;

    return ret;
}